

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfutil.cpp
# Opt level: O0

uint32_t bswap32(uint32_t data)

{
  uchar *alias;
  uint32_t data_local;
  
  return data << 0x18 | (data >> 8 & 0xff) << 0x10 | (data >> 0x10 & 0xff) << 8 | data >> 0x18;
}

Assistant:

uint32_t bswap32(uint32_t data){
    if(!(PARFLOWIO_LITTLE_ENDIAN)) return data;

    static_assert(CHAR_BIT == 8, "Byte conversion requires that char be 8 bits.");
    const unsigned char* alias = reinterpret_cast<unsigned char*>(&data);
    return 
        (static_cast<uint32_t>( alias[0] ) << 24) | 
        (static_cast<uint32_t>( alias[1] ) << 16) | 
        (static_cast<uint32_t>( alias[2] ) <<  8) | 
        (static_cast<uint32_t>( alias[3] ) <<  0);
}